

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O3

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong extraout_RAX;
  bool bVar4;
  undefined8 *extraout_RDX;
  uv_loop_t **ppuVar6;
  undefined8 *puVar7;
  uv_udp_t *puVar8;
  code **ppcVar9;
  uv__queue uVar10;
  int64_t eval_b_13;
  int64_t eval_b_14;
  sockaddr_in addr;
  sockaddr_in addr3;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  uv_udp_send_t req4;
  uv_udp_send_t req3;
  code *apcStack_5e8 [2];
  undefined8 uStack_5d8;
  code *pcStack_5d0;
  undefined8 uStack_5c0;
  code *apcStack_5b8 [2];
  undefined8 uStack_5a8;
  code *pcStack_5a0;
  undefined8 uStack_590;
  undefined1 auStack_588 [16];
  uv_udp_t local_578 [2];
  long local_3e0 [41];
  long local_298 [41];
  long local_150 [41];
  long lVar5;
  
  can_recverr = '\x01';
  auStack_588._8_8_ = (uv_loop_t *)0x1e1dc1;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_578[0].type);
  local_3e0[0] = (long)iVar1;
  local_578[0].alloc_cb = (uv_alloc_cb)0x0;
  if (local_3e0[0] == 0) {
    auStack_588._8_8_ = (uv_loop_t *)0x1e1dfd;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,&local_578[0].send_queue_size);
    local_3e0[0] = (long)iVar1;
    local_578[0].alloc_cb = (uv_alloc_cb)0x0;
    if (local_3e0[0] != 0) goto LAB_001e2307;
    auStack_588._8_8_ = (uv_loop_t *)0x1e1e39;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a5,&local_578[0].next_closing);
    local_3e0[0] = (long)iVar1;
    local_578[0].alloc_cb = (uv_alloc_cb)0x0;
    if (local_3e0[0] != 0) goto LAB_001e2319;
    auStack_588._8_8_ = (uv_loop_t *)0x1e1e64;
    uVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1e1e73;
    iVar1 = uv_timer_init(uVar2,&timer);
    local_3e0[0] = (long)iVar1;
    local_578[0].alloc_cb = (uv_alloc_cb)0x0;
    if (local_3e0[0] != 0) goto LAB_001e232b;
    auStack_588._8_8_ = (uv_loop_t *)0x1e1eb3;
    iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
    local_3e0[0] = (long)iVar1;
    local_578[0].alloc_cb = (uv_alloc_cb)0x0;
    if (local_3e0[0] != 0) goto LAB_001e233d;
    auStack_588._8_8_ = (uv_loop_t *)0x1e1ede;
    uVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1e1eed;
    iVar1 = uv_udp_init(uVar2,&client);
    local_3e0[0] = (long)iVar1;
    local_578[0].alloc_cb = (uv_alloc_cb)0x0;
    if (local_3e0[0] != 0) goto LAB_001e234f;
    auStack_588._8_8_ = (uv_loop_t *)0x1e1f26;
    iVar1 = uv_udp_bind(&client,&local_578[0].send_queue_size,0);
    local_3e0[0] = (long)iVar1;
    local_578[0].alloc_cb = (uv_alloc_cb)0x0;
    if (local_3e0[0] != 0) goto LAB_001e2361;
    auStack_588._8_8_ = (uv_loop_t *)0x1e1f66;
    iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
    local_3e0[0] = (long)iVar1;
    local_578[0].alloc_cb = (uv_alloc_cb)0x0;
    if (local_3e0[0] != 0) goto LAB_001e2373;
    auStack_588._8_8_ = (uv_loop_t *)0x1e1f9d;
    local_578[0].handle_queue = (uv__queue)uv_buf_init("PING",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1e1fd1;
    iVar1 = uv_udp_send(local_3e0,&client,&local_578[0].handle_queue,1,&local_578[0].type,send_cb);
    local_578[0].alloc_cb = (uv_alloc_cb)(long)iVar1;
    local_150[0] = 0;
    if ((uv__io_cb)local_578[0].alloc_cb != (uv__io_cb)0x0) goto LAB_001e2385;
    auStack_588._8_8_ = (uv_loop_t *)0x1e2008;
    uVar10 = (uv__queue)uv_buf_init("PANG",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1e2039;
    local_578[0].handle_queue = uVar10;
    iVar1 = uv_udp_send(&local_578[0].alloc_cb,&client,&local_578[0].handle_queue,1,
                        &local_578[0].type,send_cb);
    local_150[0] = (long)iVar1;
    local_298[0] = 0;
    if (local_150[0] != 0) goto LAB_001e2397;
    auStack_588._8_8_ = (uv_loop_t *)0x1e206a;
    uVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1e2079;
    iVar1 = uv_udp_init(uVar2,&client2);
    local_150[0] = (long)iVar1;
    local_298[0] = 0;
    if (local_150[0] != 0) goto LAB_001e23ac;
    auStack_588._8_8_ = (uv_loop_t *)0x1e20bb;
    iVar1 = uv_udp_bind(&client2,&local_578[0].next_closing,0x20);
    local_150[0] = (long)iVar1;
    local_298[0] = 0;
    if (local_150[0] != 0) goto LAB_001e23c1;
    auStack_588._8_8_ = (uv_loop_t *)0x1e2101;
    iVar1 = uv_udp_recv_start(&client2,alloc_cb,recv_cb);
    local_150[0] = (long)iVar1;
    local_298[0] = 0;
    if (local_150[0] != 0) goto LAB_001e23d6;
    auStack_588._8_8_ = (uv_loop_t *)0x1e213e;
    uVar10 = (uv__queue)uv_buf_init("PING",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1e2172;
    local_578[0].handle_queue = uVar10;
    iVar1 = uv_udp_send(local_150,&client2,&local_578[0].handle_queue,1,&local_578[0].type,
                        send_cb_recverr);
    local_298[0] = (long)iVar1;
    local_578[0].data = (uv_loop_t *)0x0;
    if (local_298[0] != 0) goto LAB_001e23eb;
    auStack_588._8_8_ = (uv_loop_t *)0x1e21a7;
    uVar10 = (uv__queue)uv_buf_init("PANG",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1e21db;
    local_578[0].handle_queue = uVar10;
    iVar1 = uv_udp_send(local_298,&client2,&local_578[0].handle_queue,1,&local_578[0].type,
                        send_cb_recverr);
    local_578[0].data = (void *)(long)iVar1;
    local_578[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_578[0].data != (uv_loop_t *)0x0) goto LAB_001e23fb;
    auStack_588._8_8_ = (uv_loop_t *)0x1e21fe;
    uVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1e2208;
    uv_run(uVar2,0);
    local_578[0].data = (void *)(long)send_cb_called;
    local_578[0].loop = (uv_loop_t *)0x4;
    if ((uv_loop_t *)local_578[0].data != (uv_loop_t *)0x4) goto LAB_001e2408;
    local_578[0].data = (void *)(long)recv_cb_called;
    local_578[0].loop = (uv_loop_t *)(long)alloc_cb_called;
    if ((uv_loop_t *)local_578[0].data != local_578[0].loop) goto LAB_001e2415;
    local_578[0].data = (uv_loop_t *)0x1;
    local_578[0].loop = (uv_loop_t *)(long)timer_cb_called;
    if (local_578[0].loop != (uv_loop_t *)0x1) goto LAB_001e2422;
    local_578[0].data = (void *)(long)close_cb_called;
    local_578[0].loop = (uv_loop_t *)0x3;
    if ((uv_loop_t *)local_578[0].data != (uv_loop_t *)0x3) goto LAB_001e242f;
    auStack_588._8_8_ = (uv_loop_t *)0x1e229c;
    uVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1e22b0;
    uv_walk(uVar2,close_walk_cb,0);
    auStack_588._8_8_ = (uv_loop_t *)0x1e22ba;
    uv_run(uVar2,0);
    local_578[0].data = (uv_loop_t *)0x0;
    auStack_588._8_8_ = (uv_loop_t *)0x1e22c7;
    uVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1e22cf;
    iVar1 = uv_loop_close(uVar2);
    local_578[0].loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)local_578[0].data == local_578[0].loop) {
      auStack_588._8_8_ = (uv_loop_t *)0x1e22ea;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_588._8_8_ = (uv_loop_t *)0x1e2307;
    run_test_udp_send_unreachable_cold_1();
LAB_001e2307:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2319;
    run_test_udp_send_unreachable_cold_2();
LAB_001e2319:
    auStack_588._8_8_ = (uv_loop_t *)0x1e232b;
    run_test_udp_send_unreachable_cold_3();
LAB_001e232b:
    auStack_588._8_8_ = (uv_loop_t *)0x1e233d;
    run_test_udp_send_unreachable_cold_4();
LAB_001e233d:
    auStack_588._8_8_ = (uv_loop_t *)0x1e234f;
    run_test_udp_send_unreachable_cold_5();
LAB_001e234f:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2361;
    run_test_udp_send_unreachable_cold_6();
LAB_001e2361:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2373;
    run_test_udp_send_unreachable_cold_7();
LAB_001e2373:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2385;
    run_test_udp_send_unreachable_cold_8();
LAB_001e2385:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2397;
    run_test_udp_send_unreachable_cold_9();
LAB_001e2397:
    auStack_588._8_8_ = (uv_loop_t *)0x1e23ac;
    run_test_udp_send_unreachable_cold_10();
LAB_001e23ac:
    auStack_588._8_8_ = (uv_loop_t *)0x1e23c1;
    run_test_udp_send_unreachable_cold_11();
LAB_001e23c1:
    auStack_588._8_8_ = (uv_loop_t *)0x1e23d6;
    run_test_udp_send_unreachable_cold_12();
LAB_001e23d6:
    auStack_588._8_8_ = (uv_loop_t *)0x1e23eb;
    run_test_udp_send_unreachable_cold_13();
LAB_001e23eb:
    auStack_588._8_8_ = (uv_loop_t *)0x1e23fb;
    run_test_udp_send_unreachable_cold_14();
LAB_001e23fb:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2408;
    run_test_udp_send_unreachable_cold_15();
LAB_001e2408:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2415;
    run_test_udp_send_unreachable_cold_16();
LAB_001e2415:
    auStack_588._8_8_ = (uv_loop_t *)0x1e2422;
    run_test_udp_send_unreachable_cold_17();
LAB_001e2422:
    auStack_588._8_8_ = (uv_loop_t *)0x1e242f;
    run_test_udp_send_unreachable_cold_18();
LAB_001e242f:
    auStack_588._8_8_ = (uv_loop_t *)0x1e243c;
    run_test_udp_send_unreachable_cold_19();
  }
  puVar8 = local_578;
  ppuVar6 = &local_578[0].loop;
  auStack_588._8_8_ = timer_cb;
  run_test_udp_send_unreachable_cold_20();
  if (puVar8 == (uv_udp_t *)&timer) {
    timer_cb_called = timer_cb_called + 1;
    auStack_588._0_8_ = (void *)0x1e246f;
    uv_close(&client,close_cb);
    if (can_recverr == '\x01') {
      auStack_588._0_8_ = (void *)0x1e248b;
      uv_close(&client2,close_cb);
    }
    iVar1 = uv_close(&timer,close_cb);
    return iVar1;
  }
  auStack_588._0_8_ = alloc_cb;
  timer_cb_cold_1();
  bVar4 = puVar8 == &client2 || puVar8 == &client;
  lVar5 = CONCAT71(0x101e4,bVar4);
  auStack_588._0_8_ = ZEXT18(bVar4);
  uStack_590 = 0;
  if ((uv_loop_t **)auStack_588._0_8_ == (uv_loop_t **)0x0) {
    pcStack_5a0 = (code *)0x1e2527;
    alloc_cb_cold_2();
  }
  else {
    uStack_590 = 0x10000;
    auStack_588._0_8_ = ppuVar6;
    if ((long)ppuVar6 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      alloc_cb_called = alloc_cb_called + 1;
      return 0x101e500;
    }
  }
  puVar8 = (uv_udp_t *)auStack_588;
  puVar7 = &uStack_590;
  pcStack_5a0 = recv_cb;
  alloc_cb_cold_1();
  uVar3 = (ulong)(puVar8 == &client2 || puVar8 == &client);
  uStack_5a8 = 0;
  pcStack_5a0 = (code *)uVar3;
  if (uVar3 == 0) {
    puVar7 = &uStack_5a8;
    apcStack_5b8[0] = (code *)0x1e25a3;
    recv_cb_cold_4();
LAB_001e25a3:
    iVar1 = (int)puVar7;
    apcStack_5b8[0] = (code *)0x1e25a8;
    recv_cb_cold_3();
  }
  else {
    recv_cb_called = recv_cb_called + 1;
    if ((long)puVar7 < 0) goto LAB_001e25a3;
    if (puVar7 != (undefined8 *)0x0) {
      if (lVar5 != 0) goto LAB_001e258f;
      apcStack_5b8[0] = (code *)0x1e258a;
      recv_cb_cold_1();
      uVar3 = extraout_RAX;
    }
    iVar1 = (int)puVar7;
    if (lVar5 == 0) {
LAB_001e258f:
      return (int)uVar3;
    }
  }
  apcStack_5b8[0] = send_cb;
  recv_cb_cold_2();
  if (lVar5 == 0) {
    pcStack_5d0 = (code *)0x1e263d;
    send_cb_cold_4();
LAB_001e263d:
    pcStack_5d0 = (code *)0x1e264c;
    send_cb_cold_1();
    pcStack_5d0 = (code *)0x1e265b;
    send_cb_cold_2();
  }
  else {
    apcStack_5b8[0] = (code *)(long)iVar1;
    uStack_5c0 = 0;
    if (apcStack_5b8[0] != (code *)0x0) goto LAB_001e263d;
    bVar4 = *(uv_udp_t **)(lVar5 + 0x48) == &client2 || *(uv_udp_t **)(lVar5 + 0x48) == &client;
    apcStack_5b8[0] = (code *)(ulong)bVar4;
    uStack_5c0 = 0;
    if (apcStack_5b8[0] != (code *)0x0) {
      send_cb_called = send_cb_called + 1;
      return (int)bVar4;
    }
  }
  ppcVar9 = apcStack_5b8;
  iVar1 = (int)&uStack_5c0;
  pcStack_5d0 = send_cb_recverr;
  send_cb_cold_3();
  if (ppcVar9 == (code **)0x0) {
    apcStack_5e8[0] = (code *)0x1e26c9;
    send_cb_recverr_cold_3();
  }
  else {
    if ((iVar1 != -0x6f) && (iVar1 != 0)) goto LAB_001e26d8;
    bVar4 = (uv_udp_t *)ppcVar9[9] == &client2 || (uv_udp_t *)ppcVar9[9] == &client;
    pcStack_5d0 = (code *)(ulong)bVar4;
    uStack_5d8 = 0;
    if (pcStack_5d0 != (code *)0x0) {
      send_cb_called = send_cb_called + 1;
      return (int)bVar4;
    }
  }
  apcStack_5e8[0] = (code *)0x1e26d8;
  send_cb_recverr_cold_1();
LAB_001e26d8:
  apcStack_5e8[0] = close_cb;
  send_cb_recverr_cold_2();
  apcStack_5e8[0] = (code *)0x1;
  iVar1 = uv_is_closing();
  if (apcStack_5e8[0] == (code *)(long)iVar1) {
    close_cb_called = close_cb_called + 1;
    return (int)apcStack_5e8[0];
  }
  ppcVar9 = apcStack_5e8;
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(ppcVar9,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  struct sockaddr_in addr3;
  uv_udp_send_t req1, req2, req3, req4;
  uv_buf_t buf;
  int r;

#ifdef __linux__
  can_recverr = 1;
#endif

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT_3, &addr3));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT_OK(r);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

  if (can_recverr) {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_OK(r);

    r = uv_udp_bind(&client2,
                    (const struct sockaddr*) &addr3,
                    UV_UDP_LINUX_RECVERR);
    ASSERT_OK(r);

    r = uv_udp_recv_start(&client2, alloc_cb, recv_cb);
    ASSERT_OK(r);

    /* client sends "PING", then "PANG" */
    buf = uv_buf_init("PING", 4);

    r = uv_udp_send(&req3,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_OK(r);

    buf = uv_buf_init("PANG", 4);

    r = uv_udp_send(&req4,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_OK(r);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(send_cb_called, (long)(can_recverr ? 4 : 2));
  ASSERT_EQ(recv_cb_called, alloc_cb_called);
  ASSERT_EQ(1, timer_cb_called);
  ASSERT_EQ(close_cb_called, (long)(can_recverr ? 3 : 2));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}